

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mem.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  size_t sVar1;
  uint uVar2;
  size_t poolCapacity;
  MemoryPool pool;
  MemoryPool local_100;
  
  local_100.freeBlocks.
  super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_100.freeBlocks;
  local_100.blockSize = 0x40000;
  local_100.totalAllocSize = 0;
  local_100.curBlockOffset = 0;
  local_100.curAllocSize = 0;
  local_100.blockPtr = (uint8_t *)0x0;
  local_100.freeBlocks.
  super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
  ._M_impl._M_node._M_size = 0;
  local_100.usedBlocks.
  super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_100.usedBlocks;
  local_100.usedBlocks.
  super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
  ._M_impl._M_node._M_size = 0;
  local_100.freeBlocks.
  super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_100.freeBlocks.
       super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  local_100.usedBlocks.
  super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_100.usedBlocks.
       super__List_base<std::pair<unsigned_char_*,_unsigned_long>,_std::allocator<std::pair<unsigned_char_*,_unsigned_long>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  phyr::MemoryPool::alloc(&local_100,4000);
  uVar2 = 1;
  if ((local_100.totalAllocSize & local_100.totalAllocSize - 1) == 0) {
    phyr::MemoryPool::reset(&local_100);
    sVar1 = local_100.totalAllocSize;
    if ((local_100.totalAllocSize & local_100.totalAllocSize - 1) == 0) {
      phyr::MemoryPool::alloc(&local_100,2000);
      uVar2 = (uint)(sVar1 != local_100.totalAllocSize);
    }
  }
  phyr::MemoryPool::reset(&local_100);
  phyr::MemoryPool::~MemoryPool(&local_100);
  return uVar2;
}

Assistant:

int main(int argc, const char* argv[]) {
    MemoryPool pool;

    // Create an array of TestUnits
    TestUnit* units = pool.alloc<TestUnit>(100);
    // Pool size must be a power of 2
    bool valid = (pool.size() & (pool.size() - 1)) == 0;

    if (valid) {
        pool.reset();
        valid = (pool.size() & (pool.size() - 1)) == 0;
    }

    if (valid) {
        size_t poolCapacity = pool.size();
        TestUnit* newUnits = pool.alloc<TestUnit>(50);
        valid = poolCapacity == pool.size();
    }

    pool.reset();
    return valid ? 0 : 1;
}